

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall crnlib::mipmapped_texture::vertical_cross_to_cubemap(mipmapped_texture *this)

{
  uint uVar1;
  int iVar2;
  image_u8 *piVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  uint uVar6;
  image_u8 *piVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint x;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  image_u8 tmp_img;
  mipmapped_texture cubemap;
  
  if ((((this->m_faces).m_size == 1) && (uVar1 = this->m_height, uVar1 - 1 < (uVar1 ^ uVar1 - 1)))
     && (uVar9 = this->m_width, (uVar9 ^ uVar9 - 1) <= uVar9 - 1)) {
    uVar6 = uVar1 >> 2;
    if (uVar6 == uVar9 / 3) {
      has_alpha(this);
      mipmapped_texture(&cubemap);
      init(&cubemap,(EVP_PKEY_CTX *)(ulong)uVar6);
      lVar16 = 0;
      do {
        tmp_img.m_width = 0;
        tmp_img.m_height = 0;
        tmp_img.m_pitch = 0;
        tmp_img.m_total = 0;
        tmp_img.m_comp_flags = 0xf;
        tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
        tmp_img.m_pixel_buf.m_size = 0;
        tmp_img.m_pixel_buf.m_capacity = 0;
        piVar7 = mip_level::get_unpacked_image(*((this->m_faces).m_p)->m_p,&tmp_img,3);
        if (3 < uVar1) {
          iVar2 = (&g_vertical_cross_image_offsets)[lVar16 * 2];
          iVar8 = (&DAT_001b2af4)[lVar16 * 2] * uVar6;
          piVar3 = (*(this->m_faces).m_p[lVar16].m_p)->m_pImage;
          uVar9 = 0;
          iVar10 = uVar6 - 1;
          do {
            iVar13 = 0;
            iVar11 = iVar2 * uVar6;
            iVar12 = uVar6 - 1;
            do {
              if (lVar16 == 5) {
                uVar15 = piVar3->m_pitch * iVar10 + iVar12;
              }
              else {
                uVar15 = piVar3->m_pitch * uVar9 + iVar13;
              }
              uVar14 = piVar7->m_pitch * iVar8 + iVar11;
              pcVar4 = piVar7->m_pPixels;
              pcVar5 = piVar3->m_pPixels;
              pcVar5[uVar15].field_0.field_0.r = pcVar4[uVar14].field_0.field_0.r;
              pcVar5[uVar15].field_0.field_0.g = pcVar4[uVar14].field_0.field_0.g;
              pcVar5[uVar15].field_0.field_0.b = pcVar4[uVar14].field_0.field_0.b;
              pcVar5[uVar15].field_0.field_0.a = pcVar4[uVar14].field_0.field_0.a;
              iVar13 = iVar13 + 1;
              iVar11 = iVar11 + 1;
              bVar17 = iVar12 != 0;
              iVar12 = iVar12 + -1;
            } while (bVar17);
            uVar9 = uVar9 + 1;
            iVar10 = iVar10 + -1;
            iVar8 = iVar8 + 1;
          } while (uVar9 != uVar6);
        }
        if (tmp_img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(tmp_img.m_pixel_buf.m_p);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      swap(this,&cubemap);
      ~mipmapped_texture(&cubemap);
      return true;
    }
  }
  return false;
}

Assistant:

bool mipmapped_texture::is_vertical_cross() const {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  if (get_num_faces() > 1)
    return false;

  if (!((math::is_power_of_2(m_height)) && (!math::is_power_of_2(m_width)) && (m_height / 4U == m_width / 3U)))
    return false;

  return true;
}